

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

string * trim(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  size_type sVar2;
  string asStack_48 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  while ((sVar2 = __return_storage_ptr__->_M_string_length, sVar2 != 0 &&
         (iVar1 = isspace((int)*(__return_storage_ptr__->_M_dataplus)._M_p), iVar1 != 0))) {
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_48);
    std::__cxx11::string::~string(asStack_48);
  }
  while( true ) {
    if (sVar2 == 0) {
      return __return_storage_ptr__;
    }
    iVar1 = isspace((int)(__return_storage_ptr__->_M_dataplus)._M_p[sVar2 - 1]);
    if (iVar1 == 0) break;
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_48);
    std::__cxx11::string::~string(asStack_48);
    sVar2 = __return_storage_ptr__->_M_string_length;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string trim(const std::string &s)
{
    std::string out = s;
    while (not out.empty() and std::isspace(out[0])) out = out.substr(1);
    while (not out.empty() and std::isspace(out[out.size()-1])) out = out.substr(0, out.size()-1);
    return out;
}